

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::FirstVectorFunction<false,_false>::Bind
          (FirstVectorFunction<false,_false> *this,ClientContext *context,
          AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference pvVar1;
  pointer pEVar2;
  reference pvVar3;
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  pvVar3 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar3 != &pEVar2->return_type) {
    pvVar3->id_ = (pEVar2->return_type).id_;
    pvVar3->physical_type_ = (pEVar2->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&pvVar3->type_info_,&(pEVar2->return_type).type_info_);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if (&(function->super_BaseScalarFunction).return_type != &pEVar2->return_type) {
    (function->super_BaseScalarFunction).return_type.id_ = (pEVar2->return_type).id_;
    (function->super_BaseScalarFunction).return_type.physical_type_ =
         (pEVar2->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(function->super_BaseScalarFunction).return_type.type_info_,
               &(pEVar2->return_type).type_info_);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, AggregateFunction &function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		function.arguments[0] = arguments[0]->return_type;
		function.return_type = arguments[0]->return_type;
		return nullptr;
	}